

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.hpp
# Opt level: O3

void __thiscall TasGrid::GridSequence::loadGpuNodes<float>(GridSequence *this)

{
  int iVar1;
  double *pdVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  pointer __p;
  pointer __p_00;
  pointer piVar6;
  long lVar7;
  int *piVar8;
  CudaSequenceData<float> *pCVar9;
  ulong uVar10;
  int *piVar11;
  long lVar12;
  long lVar13;
  CudaSequenceData<float> *pCVar14;
  Data2D<int> transpoints;
  vector<int,_std::allocator<int>_> num_nodes;
  allocator_type local_59;
  _Head_base<0UL,_TasGrid::CudaSequenceData<float>_*,_false> local_58;
  long local_50;
  vector<int,_std::allocator<int>_> local_48;
  vector<int,_std::allocator<int>_> local_30;
  
  pCVar14 = (this->gpu_cachef)._M_t.
            super___uniq_ptr_impl<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_TasGrid::CudaSequenceData<float>_*,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
            .super__Head_base<0UL,_TasGrid::CudaSequenceData<float>_*,_false>._M_head_impl;
  if (pCVar14 == (CudaSequenceData<float> *)0x0) {
    __p_00 = (pointer)operator_new(0x50);
    (__p_00->surpluses).num_entries = 0;
    (__p_00->surpluses).gpu_data = (float *)0x0;
    (__p_00->nodes).num_entries = 0;
    (__p_00->nodes).gpu_data = (float *)0x0;
    (__p_00->coeff).num_entries = 0;
    (__p_00->coeff).gpu_data = (float *)0x0;
    (__p_00->num_nodes).num_entries = 0;
    (__p_00->num_nodes).gpu_data = (int *)0x0;
    (__p_00->points).num_entries = 0;
    (__p_00->points).gpu_data = (int *)0x0;
    local_58._M_head_impl = (CudaSequenceData<float> *)0x0;
    std::
    __uniq_ptr_impl<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
    ::reset((__uniq_ptr_impl<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
             *)&this->gpu_cachef,__p_00);
    ::std::
    unique_ptr<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
    ::~unique_ptr((unique_ptr<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
                   *)&local_58);
    pCVar14 = (this->gpu_cachef)._M_t.
              super___uniq_ptr_impl<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_TasGrid::CudaSequenceData<float>_*,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
              .super__Head_base<0UL,_TasGrid::CudaSequenceData<float>_*,_false>._M_head_impl;
  }
  if ((pCVar14->num_nodes).num_entries == 0) {
    pdVar2 = (this->nodes).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    GpuVector<float>::load<double>
              (&pCVar14->nodes,(this->super_BaseCanonicalGrid).acceleration,
               (long)(this->nodes).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar2 >> 3,pdVar2);
    pdVar2 = (this->coeff).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    GpuVector<float>::load<double>
              (&((this->gpu_cachef)._M_t.
                 super___uniq_ptr_impl<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::CudaSequenceData<float>_*,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
                 .super__Head_base<0UL,_TasGrid::CudaSequenceData<float>_*,_false>._M_head_impl)->
                coeff,(this->super_BaseCanonicalGrid).acceleration,
               (long)(this->coeff).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar2 >> 3,pdVar2);
    ::std::vector<int,_std::allocator<int>_>::vector
              (&local_30,(long)(this->super_BaseCanonicalGrid).num_dimensions,
               (allocator_type *)&local_58);
    piVar3 = (this->max_levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    piVar8 = local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    for (piVar11 = (this->max_levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start; piVar11 != piVar3; piVar11 = piVar11 + 1) {
      *piVar8 = *piVar11 + 1;
      piVar8 = piVar8 + 1;
    }
    GpuVector<int>::load
              (&((this->gpu_cachef)._M_t.
                 super___uniq_ptr_impl<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::CudaSequenceData<float>_*,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
                 .super__Head_base<0UL,_TasGrid::CudaSequenceData<float>_*,_false>._M_head_impl)->
                num_nodes,(this->super_BaseCanonicalGrid).acceleration,
               (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2,
               local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start);
    lVar13 = 0x18;
    if ((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar13 = 0x40;
    }
    iVar1 = *(int *)((long)&(this->super_BaseCanonicalGrid).acceleration + lVar13);
    pCVar14 = (CudaSequenceData<float> *)(long)iVar1;
    local_50 = (long)(this->super_BaseCanonicalGrid).num_dimensions;
    local_58._M_head_impl = pCVar14;
    ::std::vector<int,_std::allocator<int>_>::vector(&local_48,local_50 * (long)pCVar14,&local_59);
    if (0 < iVar1) {
      uVar10 = (ulong)(uint)(this->super_BaseCanonicalGrid).num_dimensions;
      lVar7 = 0;
      pCVar9 = (CudaSequenceData<float> *)0x0;
      piVar6 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        if (0 < (int)uVar10) {
          lVar4 = *(long *)((long)&(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid + lVar13)
          ;
          lVar5 = *(long *)((long)&(this->super_BaseCanonicalGrid).num_dimensions + lVar13);
          lVar12 = 0;
          piVar11 = piVar6;
          do {
            *piVar11 = *(int *)(lVar4 * lVar7 + lVar5 + lVar12 * 4);
            lVar12 = lVar12 + 1;
            uVar10 = (ulong)(this->super_BaseCanonicalGrid).num_dimensions;
            piVar11 = piVar11 + (long)local_58._M_head_impl;
          } while (lVar12 < (long)uVar10);
        }
        pCVar9 = (CudaSequenceData<float> *)((long)&(pCVar9->surpluses).num_entries + 1);
        lVar7 = lVar7 + 4;
        piVar6 = piVar6 + 1;
      } while (pCVar9 != pCVar14);
    }
    GpuVector<int>::load
              (&((this->gpu_cachef)._M_t.
                 super___uniq_ptr_impl<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::CudaSequenceData<float>_*,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
                 .super__Head_base<0UL,_TasGrid::CudaSequenceData<float>_*,_false>._M_head_impl)->
                points,(this->super_BaseCanonicalGrid).acceleration,
               (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2,
               local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start);
    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void loadGpuNodes() const{
        auto& ccache = getGpuCache<T>();
        if (!ccache) ccache = Utils::make_unique<CudaSequenceData<T>>();
        if (!ccache->num_nodes.empty()) return;

        ccache->nodes.load(acceleration, nodes);
        ccache->coeff.load(acceleration, coeff);

        std::vector<int> num_nodes(num_dimensions);
        std::transform(max_levels.begin(), max_levels.end(), num_nodes.begin(), [](int i)->int{ return i+1; });
        ccache->num_nodes.load(acceleration, num_nodes);

        const MultiIndexSet *work = (points.empty()) ? &needed : &points;
        int num_points = work->getNumIndexes();
        Data2D<int> transpoints(work->getNumIndexes(), num_dimensions);
        for(int i=0; i<num_points; i++){
            for(int j=0; j<num_dimensions; j++){
                transpoints.getStrip(j)[i] = work->getIndex(i)[j];
            }
        }
        ccache->points.load(acceleration, transpoints.begin(), transpoints.end());
    }